

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

ON_V5ExtrusionDisplayMeshCache * ON_V5ExtrusionDisplayMeshCache::CreateMeshCache(ON_Extrusion *p)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  ON_UserData *p_00;
  ON_V5ExtrusionDisplayMeshCache *this_00;
  ON_UUID mesh_id;
  ON_UUID mesh_id_00;
  ON_UUID local_80;
  ON_V5ExtrusionDisplayMeshCache *local_70;
  ON_V5ExtrusionDisplayMeshCache *mc;
  ON_UUID local_58;
  undefined1 local_48 [8];
  shared_ptr<ON_Mesh> analysis_mesh;
  undefined1 local_28 [8];
  shared_ptr<ON_Mesh> render_mesh;
  ON_Extrusion *p_local;
  
  if (p == (ON_Extrusion *)0x0) {
    return (ON_V5ExtrusionDisplayMeshCache *)0x0;
  }
  render_mesh.super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p;
  uVar2 = ON_MeshCache::MeshCount(&p->m_mesh_cache);
  if (uVar2 == 0) {
    return (ON_V5ExtrusionDisplayMeshCache *)0x0;
  }
  mesh_id._0_8_ =
       &render_mesh.super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xc].
        _M_use_count;
  analysis_mesh.super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x49fda7a2f5e3baa9;
  mesh_id.Data4 = (uchar  [8])0x49fda7a2f5e3baa9;
  ON_MeshCache::MeshSharedPtr((ON_MeshCache *)local_28,mesh_id);
  mesh_id_00._0_8_ =
       &render_mesh.super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xc].
        _M_use_count;
  local_58.Data1 = 0xac12f955;
  local_58.Data2 = 0xa29f;
  local_58.Data3 = 0x437b;
  local_58.Data4[0] = 0xa4;
  local_58.Data4[1] = 0xc9;
  local_58.Data4[2] = '\x06';
  local_58.Data4[3] = 200;
  local_58.Data4[4] = '[';
  local_58.Data4[5] = '\x7f';
  local_58.Data4[6] = 0xf5;
  local_58.Data4[7] = '|';
  mesh_id_00.Data4 = (uchar  [8])0x437ba29fac12f955;
  ON_MeshCache::MeshSharedPtr((ON_MeshCache *)local_48,mesh_id_00);
  peVar3 = std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  if (peVar3 == (element_type *)0x0) {
    peVar3 = std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    if (peVar3 == (element_type *)0x0) {
      p_local = (ON_Extrusion *)0x0;
      goto LAB_004ec493;
    }
  }
  this._M_pi = render_mesh.super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  local_80 = ON_ClassId::Uuid(&m_ON_V5ExtrusionDisplayMeshCache_class_rtti);
  p_00 = ON_Object::GetUserData((ON_Object *)this._M_pi,&local_80);
  local_70 = Cast(&p_00->super_ON_Object);
  if (local_70 == (ON_V5ExtrusionDisplayMeshCache *)0x0) {
    this_00 = (ON_V5ExtrusionDisplayMeshCache *)operator_new(0xe8);
    ON_V5ExtrusionDisplayMeshCache(this_00);
    local_70 = this_00;
    bVar1 = ON_Object::AttachUserData
                      ((ON_Object *)
                       render_mesh.super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,(ON_UserData *)this_00);
    if (bVar1) {
      std::shared_ptr<ON_Mesh>::operator=(&local_70->m_render_mesh,(shared_ptr<ON_Mesh> *)local_28);
      std::shared_ptr<ON_Mesh>::operator=
                (&local_70->m_analysis_mesh,(shared_ptr<ON_Mesh> *)local_48);
    }
    else {
      if (local_70 != (ON_V5ExtrusionDisplayMeshCache *)0x0) {
        (*(local_70->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])();
      }
      local_70 = (ON_V5ExtrusionDisplayMeshCache *)0x0;
    }
  }
  p_local = (ON_Extrusion *)local_70;
LAB_004ec493:
  mc._0_4_ = 1;
  std::shared_ptr<ON_Mesh>::~shared_ptr((shared_ptr<ON_Mesh> *)local_48);
  std::shared_ptr<ON_Mesh>::~shared_ptr((shared_ptr<ON_Mesh> *)local_28);
  return (ON_V5ExtrusionDisplayMeshCache *)p_local;
}

Assistant:

ON_V5ExtrusionDisplayMeshCache* ON_V5ExtrusionDisplayMeshCache::CreateMeshCache(const ON_Extrusion* p)
{
  if ( 0 == p )
    return nullptr;

  if (p->m_mesh_cache.MeshCount() <= 0)
    return nullptr;

  std::shared_ptr<ON_Mesh> render_mesh = p->m_mesh_cache.MeshSharedPtr(ON_MeshCache::RenderMeshId);
  std::shared_ptr<ON_Mesh> analysis_mesh = p->m_mesh_cache.MeshSharedPtr(ON_MeshCache::AnalysisMeshId);

  if (nullptr == render_mesh.get() && nullptr == analysis_mesh.get() )
    return nullptr;

  ON_V5ExtrusionDisplayMeshCache* mc = ON_V5ExtrusionDisplayMeshCache::Cast( p->GetUserData(ON_CLASS_ID(ON_V5ExtrusionDisplayMeshCache)) );
  if ( nullptr == mc )
  {
    mc = new ON_V5ExtrusionDisplayMeshCache();
    if ( false == const_cast<ON_Extrusion*>(p)->AttachUserData(mc) )
    {
      delete mc;
      mc = nullptr;
    }
    else
    {
      mc->m_render_mesh = render_mesh;
      mc->m_analysis_mesh = analysis_mesh;
    }
  }

  return mc;
}